

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void __thiscall tokenizer::read_current_file(tokenizer *this)

{
  string *this_00;
  char cVar1;
  int iVar2;
  istream *piVar3;
  undefined8 extraout_RAX;
  _Alloc_hider _Var4;
  string line;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  this->line_number = 0;
  this_00 = &this->current_word;
LAB_0010b18e:
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&this->current_stream,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (this_00,"eof");
      add_token_to_stream(this,eof);
      std::__cxx11::string::~string((string *)&line);
      return;
    }
    this->line_number = this->line_number + 1;
    this->position_number = 1;
    this->line_char = line._M_dataplus._M_p;
    _Var4 = line._M_dataplus;
    while( true ) {
      cVar1 = *_Var4._M_p;
      if (cVar1 == '\0') break;
      if (this->inComment == true) {
        continue_to_read_comment(this);
        goto LAB_0010b1f5;
      }
      if ((cVar1 == ' ') || (cVar1 == '\t')) {
        this->line_char = _Var4._M_p + 1;
        goto LAB_0010b1f2;
      }
      iVar2 = isalpha((int)cVar1);
      if ((cVar1 == '_') || (iVar2 != 0)) {
        read_identifier(this);
        goto LAB_0010b1f5;
      }
      if ((int)cVar1 - 0x30U < 10) {
LAB_0010b216:
        read_number(this);
        goto LAB_0010b1f5;
      }
      switch(cVar1) {
      case '!':
      case '%':
      case '&':
      case '*':
      case '+':
      case '<':
      case '=':
      case '>':
        goto switchD_0010b23e_caseD_21;
      case '\"':
        this->line_char = _Var4._M_p + 1;
        read_string(this);
        goto LAB_0010b1f5;
      case '#':
      case '$':
      case '\'':
      case ',':
      case '.':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
switchD_0010b23e_caseD_23:
        read_invalid_token(this);
        std::__cxx11::string::~string((string *)&line);
        _Unwind_Resume(extraout_RAX);
      case '(':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,'(');
        add_token_to_stream(this,left_round_bracket);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (this_00,"");
        break;
      case ')':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,')');
        add_token_to_stream(this,right_round_bracket);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (this_00,"");
        break;
      case '-':
        if ((int)_Var4._M_p[1] - 0x30U < 10) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,'-');
          this->line_char = this->line_char + 1;
          this->position_number = this->position_number + 1;
          goto LAB_0010b216;
        }
        goto switchD_0010b23e_caseD_21;
      case '/':
        if (_Var4._M_p[1] == '*') {
          read_comment(this);
          goto LAB_0010b1f5;
        }
        if (_Var4._M_p[1] != '/') goto switchD_0010b23e_caseD_21;
        goto LAB_0010b18e;
      case ';':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,';');
        add_token_to_stream(this,semicolon);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (this_00,"");
        break;
      default:
        if (cVar1 == '{') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,'{');
          add_token_to_stream(this,left_curly_bracket);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (this_00,"");
        }
        else {
          if (cVar1 == '|') goto switchD_0010b23e_caseD_21;
          if (cVar1 != '}') goto switchD_0010b23e_caseD_23;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,'}');
          add_token_to_stream(this,right_curly_bracket);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (this_00,"");
        }
      }
      this->line_char = this->line_char + 1;
LAB_0010b1f2:
      this->position_number = this->position_number + 1;
LAB_0010b1f5:
      _Var4._M_p = this->line_char;
    }
  } while( true );
switchD_0010b23e_caseD_21:
  read_symbol(this);
  goto LAB_0010b1f5;
}

Assistant:

void tokenizer::read_current_file() {
    string line;

    line_number = 0;

    while(getline(current_stream, line)) {

        line_number++;
        position_number = 1;

        line_char = line.c_str();

        while(*line_char != '\0') {
            if(inComment) {
                this->continue_to_read_comment();
            }
            else if(*line_char == ' ' || *line_char == '\t') {
                this->advance_to_next_character();
            }
            else if(isalpha(*line_char) || *line_char == '_') {
                this->read_identifier();
            }
            else if(isdigit(*line_char)) {
                this->read_number();
            }
            else if(*line_char == '/' && *(line_char + 1) == '/') {
                break;
            }
            else if(*line_char == '/' && *(line_char + 1) == '*') {
                this->read_comment();
            }
            else if(*line_char == '-' && isdigit(*(line_char + 1))) {
                current_word += '-';
                this->advance_to_next_character();
                this->read_number();
            }
            else if(*line_char == '+' || *line_char == '-' || *line_char == '*'
            || *line_char == '/' || *line_char == '=' || *line_char == '&'
            || *line_char == '|' || *line_char == '<' || *line_char == '>'
            || *line_char == '!' || *line_char == '%') {
                this->read_symbol();
            }
            else if(*line_char == '"') {
                line_char++;
                this->read_string();
            }
            else if(*line_char == '{') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::left_curly_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == '}') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::right_curly_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == '(') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::left_round_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == ')') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::right_round_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == ';') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::semicolon);
                current_word = "";
                this->advance_to_next_character();
            }
            else {
                this->read_invalid_token();
            }
        }
    }
    current_word = "eof";
    this->add_token_to_stream(Token_Type::eof);
}